

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MazeHeap.h
# Opt level: O3

void __thiscall CMazeHeap::Push(CMazeHeap *this,CGrid *pGrid)

{
  int iVar1;
  CGrid *pCVar2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  CGrid *pCVar10;
  uint uVar11;
  uint uVar12;
  CGrid **ppCVar13;
  
  iVar5 = this->m_iSize;
  uVar4 = (ulong)iVar5;
  if (0x27fff < (long)uVar4) {
    __assert_fail("m_iSize<MAX_QUEUE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                  ,0xb4,"void CMazeHeap::Push(CGrid *)");
  }
  uVar12 = pGrid->m_iHeapPos;
  uVar9 = (ulong)(int)uVar12;
  if ((long)uVar9 < 0) {
    pGrid->m_iHeapPos = iVar5;
    this->m_iSize = iVar5 + 1;
    m_Queue[uVar4] = pGrid;
    if (iVar5 == 0) {
      return;
    }
    iVar1 = pGrid->m_iMazePCost;
    uVar12 = (iVar5 - (iVar5 + -1 >> 0x1f)) + -1 >> 1;
    pCVar10 = m_Queue[(int)uVar12];
    if (iVar1 < pCVar10->m_iMazePCost) {
      ppCVar13 = m_Queue + (int)uVar12;
      do {
        uVar9 = (ulong)uVar12;
        uVar6 = (uint)uVar4;
        if (uVar6 != uVar12) {
          pCVar2 = m_Queue[(int)uVar6];
          pCVar2->m_iHeapPos = uVar12;
          pCVar10->m_iHeapPos = uVar6;
          m_Queue[(int)uVar6] = pCVar10;
          *ppCVar13 = pCVar2;
          if (m_Queue[(int)uVar6]->m_iHeapPos != uVar6) goto LAB_001125ad;
          if (pCVar2->m_iHeapPos != uVar12) goto LAB_001124df;
        }
        uVar12 = (int)((uVar12 - ((int)(uVar12 - 1) >> 0x1f)) + -1) >> 1;
        ppCVar13 = m_Queue + (int)uVar12;
        pCVar10 = *ppCVar13;
        uVar4 = uVar9;
      } while (iVar1 < pCVar10->m_iMazePCost);
    }
  }
  else {
    if (m_Queue[uVar9] != pGrid) {
      __assert_fail("pGrid==m_Queue[pGrid->m_iHeapPos]",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                    ,0xcb,"void CMazeHeap::Push(CGrid *)");
    }
    iVar1 = pGrid->m_iMazePCost;
    if ((uVar12 == 0) || (uVar4 = (ulong)(uVar12 - 1 >> 1), m_Queue[uVar4]->m_iMazePCost <= iVar1))
    {
      if (iVar5 == 0) {
        return;
      }
      uVar6 = uVar12 * 2 + 1;
      uVar11 = uVar12 * 2 + 2;
      bVar3 = (int)uVar6 < iVar5;
      if ((int)uVar11 < iVar5 && bVar3) {
        do {
          pCVar10 = m_Queue[uVar6];
          pCVar2 = m_Queue[uVar11];
          iVar8 = (int)uVar9;
          if (pCVar10->m_iMazePCost < pCVar2->m_iMazePCost) {
            if (iVar1 <= pCVar10->m_iMazePCost) goto LAB_00112591;
            pCVar2 = m_Queue[iVar8];
            pCVar2->m_iHeapPos = uVar6;
            pCVar10->m_iHeapPos = iVar8;
            m_Queue[iVar8] = pCVar10;
            m_Queue[uVar6] = pCVar2;
            if (m_Queue[iVar8]->m_iHeapPos != iVar8) goto LAB_001125ad;
            uVar12 = uVar6;
            if (pCVar2->m_iHeapPos != uVar6) goto LAB_001124df;
          }
          else {
            if (iVar1 <= pCVar2->m_iMazePCost) goto LAB_00112591;
            pCVar10 = m_Queue[iVar8];
            pCVar10->m_iHeapPos = uVar11;
            pCVar2->m_iHeapPos = iVar8;
            m_Queue[iVar8] = pCVar2;
            m_Queue[uVar11] = pCVar10;
            if (m_Queue[iVar8]->m_iHeapPos != iVar8) goto LAB_001125ad;
            uVar12 = uVar11;
            if (pCVar10->m_iHeapPos != uVar11) goto LAB_001124df;
          }
          uVar9 = (ulong)uVar12;
          uVar6 = uVar12 * 2 + 1;
          bVar3 = (int)uVar6 < iVar5;
        } while (((int)uVar6 < iVar5) && (uVar11 = uVar12 * 2 + 2, (int)uVar11 < iVar5));
      }
      if (bVar3) {
        pCVar10 = m_Queue[uVar6];
        if (pCVar10->m_iMazePCost < iVar1) {
          pCVar2 = m_Queue[(int)uVar12];
          pCVar2->m_iHeapPos = uVar6;
          pCVar10->m_iHeapPos = uVar12;
          m_Queue[(int)uVar12] = pCVar10;
          m_Queue[uVar6] = pCVar2;
          if (m_Queue[(int)uVar12]->m_iHeapPos != uVar12) {
LAB_001125ad:
            __assert_fail("m_Queue[iPos1]->m_iHeapPos==iPos1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                          ,0x7d,"void CMazeHeap::Swab(int, int)");
          }
          if (pCVar2->m_iHeapPos != uVar6) {
LAB_001124df:
            __assert_fail("m_Queue[iPos2]->m_iHeapPos==iPos2",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                          ,0x7e,"void CMazeHeap::Swab(int, int)");
          }
        }
      }
    }
    else {
      iVar5 = m_Queue[uVar4]->m_iMazePCost;
      while (iVar1 < iVar5) {
        iVar5 = (int)uVar4;
        iVar8 = (int)uVar9;
        if (iVar8 != iVar5) {
          pCVar10 = m_Queue[iVar8];
          pCVar10->m_iHeapPos = iVar5;
          pCVar2 = m_Queue[iVar5];
          pCVar2->m_iHeapPos = iVar8;
          m_Queue[iVar8] = pCVar2;
          m_Queue[iVar5] = pCVar10;
          if (m_Queue[iVar8]->m_iHeapPos != iVar8) goto LAB_001125ad;
          if (pCVar10->m_iHeapPos != iVar5) goto LAB_001124df;
        }
        uVar7 = (ulong)(uint)((iVar5 - (iVar5 + -1 >> 0x1f)) + -1 >> 1);
        uVar9 = uVar4;
        uVar4 = uVar7;
        iVar5 = m_Queue[uVar7]->m_iMazePCost;
      }
    }
  }
LAB_00112591:
  if (m_Queue[pGrid->m_iHeapPos] == pGrid) {
    return;
  }
  __assert_fail("pGrid==m_Queue[pGrid->m_iHeapPos]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Apodead[P]BoxRouter/br_64bit_release/MazeHeap.h"
                ,0x106,"void CMazeHeap::Push(CGrid *)");
}

Assistant:

void Push(CGrid* pGrid)
	{
		assert(m_iSize<MAX_QUEUE);
		if(pGrid->m_iHeapPos<0)
		{
			int	iCurPos			=	m_iSize;
			pGrid->m_iHeapPos	=	iCurPos;

			m_Queue[m_iSize++]	=	pGrid;

			int	iCurCost	=	pGrid->GetHeapCost();

			if(iCurPos==0)	return;

			while(TRUE)
			{
				int	iParPos		=	(iCurPos-1)/2;

				if(iCurCost>=m_Queue[iParPos]->GetHeapCost())	break;			
				Swab(iCurPos,iParPos);
				iCurPos	=	iParPos;
			}
		}
		else
		{
			assert(pGrid==m_Queue[pGrid->m_iHeapPos]);
			int	iCurPos		=	pGrid->m_iHeapPos;
			int	iParPos		=	(iCurPos-1)/2;

			int	iCurCost	=	pGrid->GetHeapCost();

			if(iCurPos&&iCurCost<m_Queue[iParPos]->GetHeapCost())
			{
				while(TRUE)
				{
					int	iParPos		=	(iCurPos-1)/2;

					if(iCurCost>=m_Queue[iParPos]->GetHeapCost())	break;
					Swab(iCurPos,iParPos);
					iCurPos	=	iParPos;
				}
			}
			else
			{
				if(m_iSize==0)	return;

				while (TRUE)
				{
					int	iLChildPos	=	iCurPos+iCurPos+1;
					int	iRChildPos	=	iLChildPos+1;

					// both are valid children [2/19/2007 thyeros]
					if(iLChildPos<m_iSize&&iRChildPos<m_iSize)
					{
						int	iLChildCost	=	m_Queue[iLChildPos]->GetHeapCost();
						int	iRChildCost	=	m_Queue[iRChildPos]->GetHeapCost();

						if(iLChildCost<iRChildCost)
						{
							if(iCurCost<=iLChildCost)	break;
							Swab(iCurPos,iLChildPos);
							iCurPos	=	iLChildPos;
						}
						else
						{
							if(iCurCost<=iRChildCost)	break;
							Swab(iCurPos,iRChildPos);
							iCurPos	=	iRChildPos;
						}
					}
					else if(iLChildPos<m_iSize)
					{
						if(iCurCost<=m_Queue[iLChildPos]->GetHeapCost())	break;
						Swab(iCurPos,iLChildPos);
						break;
					}
					else 
					{
						break;
					}
				}
			}
		}

		assert(pGrid==m_Queue[pGrid->m_iHeapPos]);
	}